

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O1

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  iVar2 = optind;
  optarg = (char *)0x0;
  opterr = 0;
  optopt = 0;
  if ((((optind < ___argc) && (pcVar1 = ___argv[optind], pcVar1 != (char *)0x0)) && (*pcVar1 == '-')
      ) && (iVar3 = strcmp(pcVar1,"-"), iVar3 != 0)) {
    iVar3 = strcmp(pcVar1,"--");
    if (iVar3 != 0) {
      if ((optcursor == (char *)0x0) || (*optcursor == '\0')) {
        optcursor = pcVar1 + 1;
      }
      pcVar1 = optcursor;
      iVar3 = (int)*optcursor;
      optopt = iVar3;
      pcVar4 = strchr(__shortopts,iVar3);
      if (pcVar4 == (char *)0x0) {
        iVar3 = 0x3f;
      }
      else if (pcVar4[1] == ':') {
        optarg = pcVar1 + 1;
        if (pcVar1[1] == '\0') {
          if (pcVar4[2] == ':') {
            optarg = (char *)0x0;
          }
          else {
            optind = iVar2 + 1;
            if (optind < ___argc) {
              optarg = ___argv[optind];
            }
            else {
              optarg = (char *)0x0;
              iVar3 = (uint)(*__shortopts != ':') * 5 + 0x3a;
            }
          }
        }
        optcursor = (char *)0x0;
      }
      if ((optcursor != (char *)0x0) &&
         (pcVar1 = optcursor + 1, pcVar4 = optcursor + 1, optcursor = pcVar1, *pcVar4 != '\0')) {
        return iVar3;
      }
      optind = optind + 1;
      return iVar3;
    }
    optind = iVar2 + 1;
  }
  optcursor = (char *)0x0;
  return -1;
}

Assistant:

int getopt(int argc, char* const argv[], const char* optstring) {
  int optchar = -1;
  const char* optdecl = NULL;

  optarg = NULL;
  opterr = 0;
  optopt = 0;

  /* Unspecified, but we need it to avoid overrunning the argv bounds. */
  if (optind >= argc)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] is a null pointer, getopt()
     shall return -1 without changing optind. */
  if (argv[optind] == NULL)
    goto no_more_optchars;

  /* If, when getopt() is called *argv[optind]  is not the character '-',
     getopt() shall return -1 without changing optind. */
  if (*argv[optind] != '-')
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "-",
     getopt() shall return -1 without changing optind. */
  if (strcmp(argv[optind], "-") == 0)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "--",
     getopt() shall return -1 after incrementing optind. */
  if (strcmp(argv[optind], "--") == 0) {
    ++optind;
    goto no_more_optchars;
  }

  if (optcursor == NULL || *optcursor == '\0')
    optcursor = argv[optind] + 1;

  optchar = *optcursor;

  /* FreeBSD: The variable optopt saves the last known option character
     returned by getopt(). */
  optopt = optchar;

  /* The getopt() function shall return the next option character (if one is
     found) from argv that matches a character in optstring, if there is
     one that matches. */
  optdecl = strchr(optstring, optchar);
  if (optdecl) {
    /* [I]f a character is followed by a colon, the option takes an
       argument. */
    if (optdecl[1] == ':') {
      optarg = ++optcursor;
      if (*optarg == '\0') {
        /* GNU extension: Two colons mean an option takes an
           optional arg; if there is text in the current argv-element
           (i.e., in the same word as the option name itself, for example,
           "-oarg"), then it is returned in optarg, otherwise optarg is set
           to zero. */
        if (optdecl[2] != ':') {
          /* If the option was the last character in the string pointed to by
             an element of argv, then optarg shall contain the next element
             of argv, and optind shall be incremented by 2. If the resulting
             value of optind is greater than argc, this indicates a missing
             option-argument, and getopt() shall return an error indication.

             Otherwise, optarg shall point to the string following the
             option character in that element of argv, and optind shall be
             incremented by 1.
          */
          if (++optind < argc) {
            optarg = argv[optind];
          } else {
            /* If it detects a missing option-argument, it shall return the
               colon character ( ':' ) if the first character of optstring
               was a colon, or a question-mark character ( '?' ) otherwise.
            */
            optarg = NULL;
            optchar = (optstring[0] == ':') ? ':' : '?';
          }
        } else {
          optarg = NULL;
        }
      }

      optcursor = NULL;
    }
  } else {
    /* If getopt() encounters an option character that is not contained in
       optstring, it shall return the question-mark ( '?' ) character. */
    optchar = '?';
  }

  if (optcursor == NULL || *++optcursor == '\0')
    ++optind;

  return optchar;

no_more_optchars:
  optcursor = NULL;
  return -1;
}